

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall helics::TimeDependencies::checkForIssues_abi_cxx11_(TimeDependencies *this,bool waiting)

{
  bool bVar1;
  const_iterator __x;
  const_iterator __y;
  reference pDVar2;
  byte in_DL;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *__range1;
  bool hasDelayedTiming;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__lhs
  ;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte local_12;
  
  local_12 = in_DL & 1;
  __lhs = in_RDI;
  this_00 = in_RSI;
  __x = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                  ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)in_RDI
                  );
  __y = std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
                  ((vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *)in_RDI
                  );
  do {
    bVar1 = __gnu_cxx::
            operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                      ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                        *)__lhs,(__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair<int,_const_char_(&)[1],_true>(this_00,(int *)__x._M_current,(char (*) [1])__y._M_current)
      ;
      return __lhs;
    }
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                          *)&stack0xffffffffffffffd8);
    if (((((pDVar2->dependency & 1U) != 0) && ((pDVar2->dependent & 1U) != 0)) &&
        (((pDVar2->super_TimeData).delayedTiming & 1U) != 0)) && (pDVar2->connection != SELF)) {
      *(BaseType *)&(in_RSI->second).field_2 = (pDVar2->fedID).gid;
      if (local_12 != 0) {
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<helics::CommandErrorCodes,_const_char_(&)[80],_true>
                  (this_00,(CommandErrorCodes *)__x._M_current,(char (*) [80])__y._M_current);
        return __lhs;
      }
      local_12 = 1;
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  *)&stack0xffffffffffffffd8);
  } while( true );
}

Assistant:

std::pair<int, std::string> TimeDependencies::checkForIssues(bool waiting) const
{
    // check for timing deadlock with wait_for_current_time_flag

    bool hasDelayedTiming = waiting;
    for (const auto& dep : dependencies) {
        if (dep.dependency && dep.dependent && dep.delayedTiming &&
            dep.connection != ConnectionType::SELF) {
            mDelayedDependency = dep.fedID;
            if (hasDelayedTiming) {
                return {
                    multiple_wait_for_current_time_flags,
                    "Multiple federates declaring wait_for_current_time flag will result in deadlock"};
            }
            hasDelayedTiming = true;
        }
    }
    return {0, ""};
}